

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void generateSortTail(Parse *pParse,Select *p,SortCtx *pSort,int nColumn,SelectDest *pDest)

{
  byte bVar1;
  u8 uVar2;
  ushort uVar3;
  int p2;
  int iVar4;
  Vdbe *p_00;
  ExprList *pEVar5;
  bool bVar6;
  int p2_00;
  byte bVar7;
  int p2_01;
  int iVar8;
  int iVar9;
  int p3;
  char *pcVar10;
  Op *pOVar11;
  long lVar12;
  int p1;
  anon_union_4_2_6146edf4_for_u *paVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  int local_6c;
  int local_64;
  
  p_00 = pParse->pVdbe;
  p2 = pSort->labelDone;
  p2_01 = pParse->nLabel + -1;
  pParse->nLabel = p2_01;
  bVar1 = pDest->eDest;
  p1 = pDest->iSDParm;
  pEVar5 = p->pEList;
  iVar4 = pSort->nOBSat;
  uVar14 = pSort->pOrderBy->nExpr - iVar4;
  if (uVar14 == 1 || iVar4 == 0) {
    pcVar10 = "LAST TERM OF ";
    if (iVar4 == 0) {
      pcVar10 = "";
    }
    sqlite3VdbeExplain(pParse,'\0',"USE TEMP B-TREE FOR %sORDER BY",pcVar10);
  }
  else {
    sqlite3VdbeExplain(pParse,'\0',"USE TEMP B-TREE FOR LAST %d TERMS OF ORDER BY",(ulong)uVar14);
  }
  if (pSort->labelBkOut != 0) {
    sqlite3VdbeAddOp3(p_00,10,pSort->regReturn,pSort->labelBkOut,0);
    sqlite3VdbeAddOp3(p_00,9,0,p2,0);
    sqlite3VdbeResolveLabel(p_00,pSort->labelBkOut);
  }
  iVar4 = pSort->iECursor;
  if ((bVar1 == 9) || (bVar1 == 0xd)) {
LAB_0019080e:
    p3 = pDest->iSdst;
    local_6c = 0;
  }
  else {
    if (bVar1 == 10) {
      if (p->iOffset != 0) {
        sqlite3VdbeAddOp3(p_00,0x4b,0,pDest->iSdst,0);
      }
      goto LAB_0019080e;
    }
    uVar2 = pParse->nTempReg;
    if (uVar2 == '\0') {
      local_6c = pParse->nMem + 1;
      pParse->nMem = local_6c;
      if ((bVar1 & 0xfd) != 0xc) goto LAB_00190c3d;
LAB_00190c22:
      p3 = pParse->nMem + 1;
      pParse->nMem = p3;
LAB_00190c2f:
      nColumn = 0;
    }
    else {
      bVar7 = uVar2 - 1;
      pParse->nTempReg = bVar7;
      local_6c = pParse->aTempReg[bVar7];
      if ((bVar1 & 0xfd) == 0xc) {
        if (bVar7 == 0) goto LAB_00190c22;
        pParse->nTempReg = uVar2 - 2;
        p3 = pParse->aTempReg[(byte)(uVar2 - 2)];
        goto LAB_00190c2f;
      }
LAB_00190c3d:
      p3 = sqlite3GetTempRange(pParse,nColumn);
    }
  }
  if ((pSort->sortFlags & 1) == 0) {
    local_64 = sqlite3VdbeAddOp3(p_00,0x23,iVar4,p2,0);
    iVar8 = 1;
    iVar9 = iVar4;
    if ((0 < p->iOffset) && (sqlite3VdbeAddOp3(p_00,0x32,p->iOffset,p2_01,1), 0 < p->iOffset)) {
      sqlite3VdbeAddOp3(p_00,0x56,p->iLimit,-1,0);
    }
  }
  else {
    iVar9 = pParse->nTab;
    iVar16 = pParse->nMem + 1;
    pParse->nMem = iVar16;
    pParse->nTab = iVar9 + 1;
    if (pSort->labelBkOut == 0) {
      iVar8 = 0;
    }
    else {
      iVar8 = sqlite3VdbeAddOp3(p_00,0xf,0,0,0);
    }
    sqlite3VdbeAddOp3(p_00,0x79,iVar9,iVar16,uVar14 + 1 + nColumn);
    if (iVar8 != 0) {
      if (p_00->db->mallocFailed == '\0') {
        pOVar11 = p_00->aOp + iVar8;
      }
      else {
        pOVar11 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar11->p2 = p_00->nOp;
    }
    local_64 = sqlite3VdbeAddOp3(p_00,0x22,iVar4,p2,0);
    iVar8 = 0;
    sqlite3VdbeAddOp3(p_00,0x85,iVar4,iVar16,iVar9);
  }
  if (0 < nColumn) {
    iVar16 = iVar8 + uVar14 + -1;
    uVar15 = (ulong)(uint)nColumn;
    lVar12 = 0;
    do {
      iVar16 = iVar16 + (uint)(*(short *)((long)&pEVar5->a[0].u + lVar12) == 0);
      lVar12 = lVar12 + 0x18;
    } while (uVar15 * 0x18 != lVar12);
    if (0 < nColumn) {
      paVar13 = &pEVar5->a[uVar15 - 1].u;
      do {
        uVar3 = (paVar13->x).iOrderByCol;
        p2_00 = uVar3 - 1;
        if (uVar3 == 0) {
          p2_00 = iVar16;
        }
        iVar16 = iVar16 - (uint)(uVar3 == 0);
        sqlite3VdbeAddOp3(p_00,0x5e,iVar9,p2_00,p3 + -1 + (int)uVar15);
        paVar13 = paVar13 + -6;
        bVar6 = 1 < uVar15;
        uVar15 = uVar15 - 1;
      } while (bVar6);
    }
  }
  switch(bVar1) {
  case 9:
    p1 = pDest->iSdst;
    iVar16 = 0x54;
    uVar14 = nColumn;
    goto LAB_00190c01;
  case 10:
    break;
  case 0xb:
    pcVar10 = pDest->zAffSdst;
    iVar9 = sqlite3VdbeAddOp3(p_00,0x61,p3,nColumn,local_6c);
    sqlite3VdbeChangeP4(p_00,iVar9,pcVar10,nColumn);
    sqlite3VdbeAddOp4Int(p_00,0x8a,p1,local_6c,p3,nColumn);
    if (local_6c == 0) goto LAB_00190d10;
    goto LAB_00190cc3;
  case 0xc:
  case 0xe:
    sqlite3VdbeAddOp3(p_00,0x5e,iVar9,iVar8 + uVar14,p3);
    sqlite3VdbeAddOp3(p_00,0x7f,p1,local_6c,0);
    sqlite3VdbeAddOp3(p_00,0x80,p1,p3,local_6c);
    if (0 < (long)p_00->nOp) {
      p_00->aOp[(long)p_00->nOp + -1].p5 = 8;
    }
    break;
  default:
    p1 = pDest->iSDParm;
    iVar16 = 0xc;
    uVar14 = 0;
LAB_00190c01:
    iVar9 = 0;
LAB_00190c04:
    sqlite3VdbeAddOp3(p_00,iVar16,p1,uVar14,iVar9);
    break;
  case 0xf:
    iVar9 = pDest->iSDParm2;
    if (pParse->nTempReg == '\0') {
      uVar14 = pParse->nMem + 1;
      pParse->nMem = uVar14;
    }
    else {
      bVar7 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar7;
      uVar14 = pParse->aTempReg[bVar7];
    }
    sqlite3VdbeAddOp3(p_00,0x61,p3 - (iVar9 >> 0x1f),nColumn + (iVar9 >> 0x1f),uVar14);
    if (-1 < iVar9) {
      sqlite3VdbeAddOp4Int(p_00,0x8a,p1,uVar14,p3,iVar9);
      break;
    }
    iVar16 = 0x80;
    iVar9 = p3;
    goto LAB_00190c04;
  }
  if (local_6c == 0) goto LAB_00190d10;
  if (bVar1 == 0xb) {
LAB_00190cc3:
    if (nColumn == 1) goto LAB_00190ccd;
    if (pParse->nRangeReg < nColumn) {
      pParse->nRangeReg = nColumn;
      pParse->iRangeReg = p3;
    }
  }
  else {
LAB_00190ccd:
    if (p3 != 0) {
      bVar1 = pParse->nTempReg;
      if ((ulong)bVar1 < 8) {
        pParse->nTempReg = bVar1 + 1;
        pParse->aTempReg[bVar1] = p3;
      }
    }
  }
  bVar1 = pParse->nTempReg;
  if ((ulong)bVar1 < 8) {
    pParse->nTempReg = bVar1 + 1;
    pParse->aTempReg[bVar1] = local_6c;
  }
LAB_00190d10:
  sqlite3VdbeResolveLabel(p_00,p2_01);
  sqlite3VdbeAddOp3(p_00,(uint)((pSort->sortFlags & 1) == 0) * 2 + 0x25,iVar4,local_64 + 1,0);
  if (pSort->regReturn != 0) {
    sqlite3VdbeAddOp3(p_00,0x43,pSort->regReturn,0,0);
  }
  sqlite3VdbeResolveLabel(p_00,p2);
  return;
}

Assistant:

static void generateSortTail(
  Parse *pParse,    /* Parsing context */
  Select *p,        /* The SELECT statement */
  SortCtx *pSort,   /* Information on the ORDER BY clause */
  int nColumn,      /* Number of columns of data */
  SelectDest *pDest /* Write the sorted results here */
){
  Vdbe *v = pParse->pVdbe;                     /* The prepared statement */
  int addrBreak = pSort->labelDone;            /* Jump here to exit loop */
  int addrContinue = sqlite3VdbeMakeLabel(pParse);/* Jump here for next cycle */
  int addr;                       /* Top of output loop. Jump for Next. */
  int addrOnce = 0;
  int iTab;
  ExprList *pOrderBy = pSort->pOrderBy;
  int eDest = pDest->eDest;
  int iParm = pDest->iSDParm;
  int regRow;
  int regRowid;
  int iCol;
  int nKey;                       /* Number of key columns in sorter record */
  int iSortTab;                   /* Sorter cursor to read from */
  int i;
  int bSeq;                       /* True if sorter record includes seq. no. */
  int nRefKey = 0;
  struct ExprList_item *aOutEx = p->pEList->a;
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  int addrExplain;                /* Address of OP_Explain instruction */
#endif

  nKey = pOrderBy->nExpr - pSort->nOBSat;
  if( pSort->nOBSat==0 || nKey==1 ){
    ExplainQueryPlan2(addrExplain, (pParse, 0,
      "USE TEMP B-TREE FOR %sORDER BY", pSort->nOBSat?"LAST TERM OF ":""
    ));
  }else{
    ExplainQueryPlan2(addrExplain, (pParse, 0,
      "USE TEMP B-TREE FOR LAST %d TERMS OF ORDER BY", nKey
    ));
  }
  sqlite3VdbeScanStatusRange(v, addrExplain,pSort->addrPush,pSort->addrPushEnd);
  sqlite3VdbeScanStatusCounters(v, addrExplain, addrExplain, pSort->addrPush);


  assert( addrBreak<0 );
  if( pSort->labelBkOut ){
    sqlite3VdbeAddOp2(v, OP_Gosub, pSort->regReturn, pSort->labelBkOut);
    sqlite3VdbeGoto(v, addrBreak);
    sqlite3VdbeResolveLabel(v, pSort->labelBkOut);
  }

#ifdef SQLITE_ENABLE_SORTER_REFERENCES
  /* Open any cursors needed for sorter-reference expressions */
  for(i=0; i<pSort->nDefer; i++){
    Table *pTab = pSort->aDefer[i].pTab;
    int iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
    sqlite3OpenTable(pParse, pSort->aDefer[i].iCsr, iDb, pTab, OP_OpenRead);
    nRefKey = MAX(nRefKey, pSort->aDefer[i].nKey);
  }
#endif

  iTab = pSort->iECursor;
  if( eDest==SRT_Output || eDest==SRT_Coroutine || eDest==SRT_Mem ){
    if( eDest==SRT_Mem && p->iOffset ){
      sqlite3VdbeAddOp2(v, OP_Null, 0, pDest->iSdst);
    }
    regRowid = 0;
    regRow = pDest->iSdst;
  }else{
    regRowid = sqlite3GetTempReg(pParse);
    if( eDest==SRT_EphemTab || eDest==SRT_Table ){
      regRow = sqlite3GetTempReg(pParse);
      nColumn = 0;
    }else{
      regRow = sqlite3GetTempRange(pParse, nColumn);
    }
  }
  if( pSort->sortFlags & SORTFLAG_UseSorter ){
    int regSortOut = ++pParse->nMem;
    iSortTab = pParse->nTab++;
    if( pSort->labelBkOut ){
      addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
    }
    sqlite3VdbeAddOp3(v, OP_OpenPseudo, iSortTab, regSortOut,
        nKey+1+nColumn+nRefKey);
    if( addrOnce ) sqlite3VdbeJumpHere(v, addrOnce);
    addr = 1 + sqlite3VdbeAddOp2(v, OP_SorterSort, iTab, addrBreak);
    VdbeCoverage(v);
    assert( p->iLimit==0 && p->iOffset==0 );
    sqlite3VdbeAddOp3(v, OP_SorterData, iTab, regSortOut, iSortTab);
    bSeq = 0;
  }else{
    addr = 1 + sqlite3VdbeAddOp2(v, OP_Sort, iTab, addrBreak); VdbeCoverage(v);
    codeOffset(v, p->iOffset, addrContinue);
    iSortTab = iTab;
    bSeq = 1;
    if( p->iOffset>0 ){
      sqlite3VdbeAddOp2(v, OP_AddImm, p->iLimit, -1);
    }
  }
  for(i=0, iCol=nKey+bSeq-1; i<nColumn; i++){
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( aOutEx[i].fg.bSorterRef ) continue;
#endif
    if( aOutEx[i].u.x.iOrderByCol==0 ) iCol++;
  }
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
  if( pSort->nDefer ){
    int iKey = iCol+1;
    int regKey = sqlite3GetTempRange(pParse, nRefKey);

    for(i=0; i<pSort->nDefer; i++){
      int iCsr = pSort->aDefer[i].iCsr;
      Table *pTab = pSort->aDefer[i].pTab;
      int nKey = pSort->aDefer[i].nKey;

      sqlite3VdbeAddOp1(v, OP_NullRow, iCsr);
      if( HasRowid(pTab) ){
        sqlite3VdbeAddOp3(v, OP_Column, iSortTab, iKey++, regKey);
        sqlite3VdbeAddOp3(v, OP_SeekRowid, iCsr,
            sqlite3VdbeCurrentAddr(v)+1, regKey);
      }else{
        int k;
        int iJmp;
        assert( sqlite3PrimaryKeyIndex(pTab)->nKeyCol==nKey );
        for(k=0; k<nKey; k++){
          sqlite3VdbeAddOp3(v, OP_Column, iSortTab, iKey++, regKey+k);
        }
        iJmp = sqlite3VdbeCurrentAddr(v);
        sqlite3VdbeAddOp4Int(v, OP_SeekGE, iCsr, iJmp+2, regKey, nKey);
        sqlite3VdbeAddOp4Int(v, OP_IdxLE, iCsr, iJmp+3, regKey, nKey);
        sqlite3VdbeAddOp1(v, OP_NullRow, iCsr);
      }
    }
    sqlite3ReleaseTempRange(pParse, regKey, nRefKey);
  }
#endif
  for(i=nColumn-1; i>=0; i--){
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( aOutEx[i].fg.bSorterRef ){
      sqlite3ExprCode(pParse, aOutEx[i].pExpr, regRow+i);
    }else
#endif
    {
      int iRead;
      if( aOutEx[i].u.x.iOrderByCol ){
        iRead = aOutEx[i].u.x.iOrderByCol-1;
      }else{
        iRead = iCol--;
      }
      sqlite3VdbeAddOp3(v, OP_Column, iSortTab, iRead, regRow+i);
      VdbeComment((v, "%s", aOutEx[i].zEName));
    }
  }
  sqlite3VdbeScanStatusRange(v, addrExplain, addrExplain, -1);
  switch( eDest ){
    case SRT_Table:
    case SRT_EphemTab: {
      sqlite3VdbeAddOp3(v, OP_Column, iSortTab, nKey+bSeq, regRow);
      sqlite3VdbeAddOp2(v, OP_NewRowid, iParm, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, iParm, regRow, regRowid);
      sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case SRT_Set: {
      assert( nColumn==sqlite3Strlen30(pDest->zAffSdst) );
      sqlite3VdbeAddOp4(v, OP_MakeRecord, regRow, nColumn, regRowid,
                        pDest->zAffSdst, nColumn);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, regRowid, regRow, nColumn);
      break;
    }
    case SRT_Mem: {
      /* The LIMIT clause will terminate the loop for us */
      break;
    }
#endif
    case SRT_Upfrom: {
      int i2 = pDest->iSDParm2;
      int r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_MakeRecord,regRow+(i2<0),nColumn-(i2<0),r1);
      if( i2<0 ){
        sqlite3VdbeAddOp3(v, OP_Insert, iParm, r1, regRow);
      }else{
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, regRow, i2);
      }
      break;
    }
    default: {
      assert( eDest==SRT_Output || eDest==SRT_Coroutine );
      testcase( eDest==SRT_Output );
      testcase( eDest==SRT_Coroutine );
      if( eDest==SRT_Output ){
        sqlite3VdbeAddOp2(v, OP_ResultRow, pDest->iSdst, nColumn);
      }else{
        sqlite3VdbeAddOp1(v, OP_Yield, pDest->iSDParm);
      }
      break;
    }
  }
  if( regRowid ){
    if( eDest==SRT_Set ){
      sqlite3ReleaseTempRange(pParse, regRow, nColumn);
    }else{
      sqlite3ReleaseTempReg(pParse, regRow);
    }
    sqlite3ReleaseTempReg(pParse, regRowid);
  }
  /* The bottom of the loop
  */
  sqlite3VdbeResolveLabel(v, addrContinue);
  if( pSort->sortFlags & SORTFLAG_UseSorter ){
    sqlite3VdbeAddOp2(v, OP_SorterNext, iTab, addr); VdbeCoverage(v);
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, iTab, addr); VdbeCoverage(v);
  }
  sqlite3VdbeScanStatusRange(v, addrExplain, sqlite3VdbeCurrentAddr(v)-1, -1);
  if( pSort->regReturn ) sqlite3VdbeAddOp1(v, OP_Return, pSort->regReturn);
  sqlite3VdbeResolveLabel(v, addrBreak);
}